

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCut.c
# Opt level: O3

void Sbd_StoComputeCutsObj(Sbd_Sto_t *p,int iObj,int Delay,int Level)

{
  Vec_Wec_t *pVVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  pVVar2 = p->vDelays;
  if (iObj < pVVar2->nSize) {
    if (-1 < iObj) {
      pVVar2->pArray[(uint)iObj] = Delay;
      if (iObj < p->vLevels->nSize) {
        p->vLevels->pArray[(uint)iObj] = Level;
        return;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                  ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  if (pVVar2->nSize != iObj) {
    __assert_fail("iObj == Vec_IntSize(p->vDelays)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                  ,0x2c7,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
  }
  if (p->vLevels->nSize == iObj) {
    if (p->vCuts->nSize != iObj) {
      __assert_fail("iObj == Vec_WecSize(p->vCuts)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                    ,0x2c9,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
    }
    Vec_IntPush(pVVar2,Delay);
    Vec_IntPush(p->vLevels,Level);
    pVVar1 = p->vCuts;
    uVar5 = pVVar1->nSize;
    if (uVar5 == pVVar1->nCap) {
      if ((int)uVar5 < 0x10) {
        if (pVVar1->pArray == (Vec_Int_t *)0x0) {
          pVVar2 = (Vec_Int_t *)malloc(0x100);
        }
        else {
          pVVar2 = (Vec_Int_t *)realloc(pVVar1->pArray,0x100);
          uVar5 = pVVar1->nCap;
        }
        pVVar1->pArray = pVVar2;
        iVar3 = 0x10 - uVar5;
        pVVar2 = pVVar2 + (int)uVar5;
        iVar4 = 0x10;
      }
      else {
        iVar4 = uVar5 * 2;
        if (pVVar1->pArray == (Vec_Int_t *)0x0) {
          pVVar2 = (Vec_Int_t *)malloc((ulong)uVar5 << 5);
        }
        else {
          pVVar2 = (Vec_Int_t *)realloc(pVVar1->pArray,(ulong)uVar5 << 5);
          uVar5 = pVVar1->nCap;
        }
        pVVar1->pArray = pVVar2;
        iVar3 = iVar4 - uVar5;
        pVVar2 = pVVar2 + (int)uVar5;
      }
      memset(pVVar2,0,(long)iVar3 << 4);
      pVVar1->nCap = iVar4;
      uVar5 = pVVar1->nSize;
    }
    pVVar1->nSize = uVar5 + 1;
    if (-1 < (int)uVar5) {
      return;
    }
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                  ,0xa1,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
  }
  __assert_fail("iObj == Vec_IntSize(p->vLevels)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCut.c"
                ,0x2c8,"void Sbd_StoComputeCutsObj(Sbd_Sto_t *, int, int, int)");
}

Assistant:

void Sbd_StoComputeCutsObj( Sbd_Sto_t * p, int iObj, int Delay, int Level )
{
    if ( iObj < Vec_IntSize(p->vDelays) )
    {
        Vec_IntWriteEntry( p->vDelays, iObj, Delay );
        Vec_IntWriteEntry( p->vLevels, iObj, Level );
    }
    else
    {
        assert( iObj == Vec_IntSize(p->vDelays) );
        assert( iObj == Vec_IntSize(p->vLevels) );
        assert( iObj == Vec_WecSize(p->vCuts) );
        Vec_IntPush( p->vDelays, Delay );
        Vec_IntPush( p->vLevels, Level );
        Vec_WecPushLevel( p->vCuts );
    }
}